

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t parse_device(dev_t *pdev,archive *a,char *val)

{
  char *pcVar1;
  pack_t_conflict *ppVar2;
  size_t sVar3;
  unsigned_long uVar4;
  dev_t dVar5;
  ulong uVar6;
  char *pcVar7;
  char *error;
  char *local_58;
  char *val_local;
  unsigned_long numbers [3];
  
  error = (char *)0x0;
  *pdev = 0;
  val_local = val;
  pcVar1 = strchr(val,0x2c);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    ppVar2 = pack_find(val);
    if (ppVar2 == (pack_t_conflict *)0x0) {
      pcVar1 = "Unknown format `%s\'";
    }
    else {
      uVar6 = 0;
      pcVar1 = pcVar1 + 1;
      while (*pcVar1 != '\0') {
        sVar3 = strcspn(pcVar1,",");
        pcVar7 = pcVar1 + sVar3;
        if (pcVar1[sVar3] != '\0') {
          *pcVar7 = '\0';
          pcVar7 = pcVar7 + 1;
        }
        local_58 = pcVar1;
        if (*pcVar1 == '\0') {
          pcVar1 = "Missing number";
          goto LAB_00145b5c;
        }
        if (uVar6 == 3) {
          pcVar1 = "Too many arguments";
          goto LAB_00145b5c;
        }
        uVar4 = mtree_atol(&local_58,L'\0');
        numbers[uVar6] = uVar4;
        uVar6 = uVar6 + 1;
        pcVar1 = pcVar7;
      }
      if (uVar6 < 2) {
        pcVar1 = "Not enough arguments";
LAB_00145b5c:
        archive_set_error(a,0x54,pcVar1);
        return L'\xffffffec';
      }
      dVar5 = (*ppVar2)((int)uVar6,numbers,&error);
      if (error == (char *)0x0) goto LAB_00145b1d;
      pcVar1 = "%s";
      val = error;
    }
    archive_set_error(a,0x54,pcVar1,val);
    return L'\xffffffec';
  }
  dVar5 = mtree_atol(&val_local,L'\0');
LAB_00145b1d:
  *pdev = dVar5;
  return L'\0';
}

Assistant:

static int
parse_device(dev_t *pdev, struct archive *a, char *val)
{
#define MAX_PACK_ARGS 3
	unsigned long numbers[MAX_PACK_ARGS];
	char *p, *dev;
	int argc;
	pack_t *pack;
	dev_t result;
	const char *error = NULL;

	memset(pdev, 0, sizeof(*pdev));
	if ((dev = strchr(val, ',')) != NULL) {
		/*
		 * Device's major/minor are given in a specified format.
		 * Decode and pack it accordingly.
		 */
		*dev++ = '\0';
		if ((pack = pack_find(val)) == NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown format `%s'", val);
			return ARCHIVE_WARN;
		}
		argc = 0;
		while ((p = la_strsep(&dev, ",")) != NULL) {
			if (*p == '\0') {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing number");
				return ARCHIVE_WARN;
			}
			if (argc >= MAX_PACK_ARGS) {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too many arguments");
				return ARCHIVE_WARN;
			}
			numbers[argc++] = (unsigned long)mtree_atol(&p, 0);
		}
		if (argc < 2) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Not enough arguments");
			return ARCHIVE_WARN;
		}
		result = (*pack)(argc, numbers, &error);
		if (error != NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "%s", error);
			return ARCHIVE_WARN;
		}
	} else {
		/* file system raw value. */
		result = (dev_t)mtree_atol(&val, 0);
	}
	*pdev = result;
	return ARCHIVE_OK;
#undef MAX_PACK_ARGS
}